

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O0

QByteArray * qgetenv(char *varName)

{
  QByteArray *in_RSI;
  QMutex *in_RDI;
  long in_FS_OFFSET;
  scoped_lock<QMutex> locker;
  QMutex *size;
  char *data;
  char local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10[0] = -0x56;
  local_10[1] = -0x56;
  local_10[2] = -0x56;
  local_10[3] = -0x56;
  local_10[4] = -0x56;
  local_10[5] = -0x56;
  local_10[6] = -0x56;
  local_10[7] = -0x56;
  data = local_10;
  size = in_RDI;
  (anonymous_namespace)::qt_scoped_lock<QMutex,std::scoped_lock<QMutex>>(in_RDI);
  getenv((char *)in_RSI);
  QByteArray::QByteArray(in_RSI,data,(qsizetype)size);
  std::scoped_lock<QMutex>::~scoped_lock((scoped_lock<QMutex> *)0x175c19);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray qgetenv(const char *varName)
{
    const auto locker = qt_scoped_lock(environmentMutex);
    return QByteArray(::getenv(varName));
}